

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder.cpp
# Opt level: O3

string * __thiscall
bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
          (string *__return_storage_ptr__,HexEncoder *this,uchar *bytes,size_t len)

{
  string *psVar1;
  uchar *puVar2;
  stringstream ss;
  char local_1c1;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (bytes != (uchar *)0x0) {
    puVar2 = (uchar *)0x0;
    do {
      local_1c1 = *(char *)(HEX_CHARS + (ulong)((byte)this[(long)puVar2] >> 4));
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1c1,1);
      local_1c1 = *(char *)(HEX_CHARS + (ulong)((byte)this[(long)puVar2] & 0xf));
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1c1,1);
      puVar2 = puVar2 + 1;
    } while (bytes != puVar2);
  }
  psVar1 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string HexEncoder::EncodeAsHex(unsigned char* bytes, size_t len)
{
    std::stringstream ss;

    for (unsigned long i = 0u; i < len; i++)
    {
        ss << HexEncoder::HEX_CHARS[((unsigned int) bytes[i] >> 4u & 0xfu)];
        ss << HexEncoder::HEX_CHARS[(unsigned int) bytes[i] & 0xfu];
    }

    return ss.str();
}